

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# context-decls.cpp
# Opt level: O2

Result<wasm::Ok> * __thiscall
wasm::WATParser::ParseDeclsCtx::addElem
          (Result<wasm::Ok> *__return_storage_ptr__,ParseDeclsCtx *this,Name name,TableIdxT *param_2
          ,optional<wasm::Ok> param_3,ElemListT *param_4,Index pos)

{
  int __val;
  ElementSegment *pEVar1;
  string local_98;
  undefined1 local_78 [24];
  _Vector_base<wasm::WATParser::Annotation,_std::allocator<wasm::WATParser::Annotation>_> local_60;
  string_view local_48;
  _Head_base<0UL,_wasm::ElementSegment_*,_false> local_38;
  __single_object e;
  
  std::make_unique<wasm::ElementSegment>();
  if (name.super_IString.str._M_str == (char *)0x0) {
    __val = this->elemCounter;
    this->elemCounter = __val + 1;
    std::__cxx11::to_string((string *)local_78,__val);
    IString::IString((IString *)&local_48,(string *)local_78);
    std::__cxx11::string::~string((string *)local_78);
    name = Names::getValidElementSegmentName(this->wasm,(Name)local_48);
    ((local_38._M_head_impl)->super_Named).name.super_IString.str =
         (string_view)name.super_IString.str;
  }
  else {
    pEVar1 = Module::getElementSegmentOrNull(this->wasm,name);
    if (pEVar1 != (ElementSegment *)0x0) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_98,"repeated element segment name",(allocator<char> *)&local_48);
      Lexer::err((Err *)local_78,&this->in,(ulong)pos,&local_98);
      std::__detail::__variant::_Variant_storage<false,wasm::Ok,wasm::Err>::
      _Variant_storage<1ul,wasm::Err>
                ((_Variant_storage<false,wasm::Ok,wasm::Err> *)__return_storage_ptr__,local_78);
      std::__cxx11::string::~string((string *)local_78);
      std::__cxx11::string::~string((string *)&local_98);
      goto LAB_00bfee77;
    }
    ((local_38._M_head_impl)->super_Named).name.super_IString.str =
         (string_view)name.super_IString.str;
    ((local_38._M_head_impl)->super_Named).hasExplicitName = true;
  }
  local_78._16_4_ = pos;
  local_78._20_4_ =
       (undefined4)
       ((ulong)((long)(this->wasm->elementSegments).
                      super__Vector_base<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>,_std::allocator<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
               (long)(this->wasm->elementSegments).
                     super__Vector_base<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>,_std::allocator<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start) >> 3);
  local_60._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_60._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_60._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_78._0_16_ = (undefined1  [16])name.super_IString.str;
  std::vector<wasm::WATParser::DefPos,_std::allocator<wasm::WATParser::DefPos>_>::
  emplace_back<wasm::WATParser::DefPos>(&this->elemDefs,(DefPos *)local_78);
  std::_Vector_base<wasm::WATParser::Annotation,_std::allocator<wasm::WATParser::Annotation>_>::
  ~_Vector_base(&local_60);
  Module::addElementSegment
            (this->wasm,
             (unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_> *)
             &local_38);
  *(__index_type *)
   ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
           super__Move_assign_alias<wasm::Ok,_wasm::Err>.
           super__Copy_assign_alias<wasm::Ok,_wasm::Err>.super__Move_ctor_alias<wasm::Ok,_wasm::Err>
           .super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
           super__Variant_storage_alias<wasm::Ok,_wasm::Err> + 0x20) = '\0';
LAB_00bfee77:
  std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>::~unique_ptr
            ((unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_> *)
             &local_38);
  return __return_storage_ptr__;
}

Assistant:

Result<> ParseDeclsCtx::addElem(
  Name name, TableIdxT*, std::optional<ExprT>, ElemListT&&, Index pos) {
  auto e = std::make_unique<ElementSegment>();
  if (name) {
    if (wasm.getElementSegmentOrNull(name)) {
      // TDOO: if the existing segment is not explicitly named, fix its name and
      // continue.
      return in.err(pos, "repeated element segment name");
    }
    e->setExplicitName(name);
  } else {
    name = std::to_string(elemCounter++);
    name = Names::getValidElementSegmentName(wasm, name);
    e->name = name;
  }
  // TODO: element segment annotations
  elemDefs.push_back({name, pos, Index(wasm.elementSegments.size()), {}});
  wasm.addElementSegment(std::move(e));
  return Ok{};
}